

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O2

Aig_Man_t * Abc_NtkAigForConstraints(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  Aig_Man_t *pCare;
  int i;
  Aig_Man_t *p_00;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Int_t *p_01;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *p_02;
  int iVar5;
  int iVar6;
  
  iVar6 = 0;
  if (p->pCare == (Aig_Man_t *)0x0) {
    p_00 = (Aig_Man_t *)0x0;
  }
  else {
    p_00 = Aig_ManStart(1000);
    Aig_ManIncrementTravId(p->pCare);
    while( true ) {
      p_02 = p->vSupp;
      iVar5 = p_02->nSize;
      if (iVar5 <= iVar6) break;
      pvVar1 = Vec_PtrEntry(p_02,iVar6);
      pAVar2 = Aig_ManCi(p->pCare,*(int *)((long)pvVar1 + 0x38));
      pAVar2->TravId = p->pCare->nTravIds;
      pAVar3 = Aig_ObjCreateCi(p_00);
      (pAVar2->field_5).pData = pAVar3;
      iVar6 = iVar6 + 1;
    }
    pAVar2 = p_00->pConst1;
    for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
      pvVar1 = Vec_PtrEntry(p_02,iVar6);
      p_01 = (Vec_Int_t *)Vec_PtrEntry(p->vSuppsInv,*(int *)((long)pvVar1 + 0x38));
      for (iVar5 = 0; iVar5 < p_01->nSize; iVar5 = iVar5 + 1) {
        i = Vec_IntEntry(p_01,iVar5);
        pAVar3 = Aig_ManCo(p->pCare,i);
        pCare = p->pCare;
        if (pAVar3->TravId != pCare->nTravIds) {
          pAVar3->TravId = pCare->nTravIds;
          pAVar4 = (Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe);
          if (pCare->pConst1 != pAVar4) {
            pAVar4 = Abc_NtkConstructCare_rec(pCare,pAVar4,p_00);
            if (pAVar4 != (Aig_Obj_t *)0x0) {
              pAVar2 = Aig_And(p_00,pAVar2,
                               (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin0 & 1) ^ (ulong)pAVar4));
            }
          }
        }
      }
      p_02 = p->vSupp;
      iVar5 = p_02->nSize;
    }
    Aig_ObjCreateCo(p_00,pAVar2);
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Abc_NtkAigForConstraints( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    Aig_Man_t * pMan;
    Aig_Obj_t * pPi, * pPo, * pObjAig, * pObjRoot;
    Vec_Int_t * vOuts;
    int i, k, iOut;
    if ( p->pCare == NULL )
        return NULL;
    pMan = Aig_ManStart( 1000 );
    // mark the care set
    Aig_ManIncrementTravId( p->pCare );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        pPi = Aig_ManCi( p->pCare, (int)(ABC_PTRUINT_T)pFanin->pData );
        Aig_ObjSetTravIdCurrent( p->pCare, pPi );
        pPi->pData = Aig_ObjCreateCi(pMan);
    }
    // construct the constraints
    pObjRoot = Aig_ManConst1(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vSuppsInv, (int)(ABC_PTRUINT_T)pFanin->pData );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( p->pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( p->pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( p->pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(p->pCare) )
                continue;
            pObjAig = Abc_NtkConstructCare_rec( p->pCare, Aig_ObjFanin0(pPo), pMan );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            pObjRoot = Aig_And( pMan, pObjRoot, pObjAig );
        }
    }
    Aig_ObjCreateCo( pMan, pObjRoot );
    Aig_ManCleanup( pMan );
    return pMan;
}